

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O0

int run_test_udp_send_and_recv(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_178;
  int r;
  uv_buf_t buf;
  uv_udp_send_t req;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&req.bufsml[3].len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xa6,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&server);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xa9,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind(&server,&req.bufsml[3].len,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xac,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xaf,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&req.bufsml[3].len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xb1,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xb4,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  auVar3 = uv_buf_init("PING",4);
  buf.base = auVar3._8_8_;
  uStack_178 = auVar3._0_8_;
  iVar1 = uv_udp_send(&buf.len,&client,&stack0xfffffffffffffe88,1,&req.bufsml[3].len,cl_send_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xbf,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc1,"close_cb_called","==","0",(long)close_cb_called,"==",0);
    abort();
  }
  if ((long)cl_send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc2,"cl_send_cb_called","==","0",(long)cl_send_cb_called,"==",0);
    abort();
  }
  if ((long)cl_recv_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc3,"cl_recv_cb_called","==","0",(long)cl_recv_cb_called,"==",0);
    abort();
  }
  if ((long)sv_send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc4,"sv_send_cb_called","==","0",(long)sv_send_cb_called,"==",0);
    abort();
  }
  if ((long)sv_recv_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc5,"sv_recv_cb_called","==","0",(long)sv_recv_cb_called,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if ((long)cl_send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xc9,"1","==","cl_send_cb_called",1,"==",(long)cl_send_cb_called);
    abort();
  }
  if ((long)cl_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xca,"1","==","cl_recv_cb_called",1,"==",(long)cl_recv_cb_called);
    abort();
  }
  if ((long)sv_send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xcb,"1","==","sv_send_cb_called",1,"==",(long)sv_send_cb_called);
    abort();
  }
  if ((long)sv_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xcc,"1","==","sv_recv_cb_called",1,"==",(long)sv_recv_cb_called);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xcd,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xcf,"client.send_queue_size","==","0",client.send_queue_size,"==",0);
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xd0,"server.send_queue_size","==","0",server.send_queue_size,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0xd2,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_send_and_recv) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", expects "PONG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_send_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);
  ASSERT_OK(sv_recv_cb_called);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, cl_send_cb_called);
  ASSERT_EQ(1, cl_recv_cb_called);
  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}